

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_bridgeloader>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_bridgeloader> *this)

{
  Holder<(anonymous_namespace)::Q_QGS_bridgeloader> *in_RDI;
  void *in_stack_00000010;
  char newValue;
  
  pointer(in_RDI);
  newValue = (char)((ulong)in_RDI >> 0x38);
  anon_unknown.dwarf_18b4a2c::Q_QGS_bridgeloader::innerFunction(in_stack_00000010);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)&this->storage,newValue);
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }